

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imath_3_1::Matrix44<float>_>::readValueFrom
          (TypedAttribute<Imath_3_1::Matrix44<float>_> *this,IStream *is,int size,int version)

{
  IStream *in_RSI;
  long in_RDI;
  float *in_stack_ffffffffffffff58;
  
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  Imath_3_1::Matrix44<float>::operator[]((Matrix44<float> *)(in_RDI + 8),3);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,in_stack_ffffffffffffff58);
  return;
}

Assistant:

IMF_EXPORT void
M44fAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value[0][0]);
    Xdr::read<StreamIO> (is, _value[0][1]);
    Xdr::read<StreamIO> (is, _value[0][2]);
    Xdr::read<StreamIO> (is, _value[0][3]);

    Xdr::read<StreamIO> (is, _value[1][0]);
    Xdr::read<StreamIO> (is, _value[1][1]);
    Xdr::read<StreamIO> (is, _value[1][2]);
    Xdr::read<StreamIO> (is, _value[1][3]);

    Xdr::read<StreamIO> (is, _value[2][0]);
    Xdr::read<StreamIO> (is, _value[2][1]);
    Xdr::read<StreamIO> (is, _value[2][2]);
    Xdr::read<StreamIO> (is, _value[2][3]);

    Xdr::read<StreamIO> (is, _value[3][0]);
    Xdr::read<StreamIO> (is, _value[3][1]);
    Xdr::read<StreamIO> (is, _value[3][2]);
    Xdr::read<StreamIO> (is, _value[3][3]);
}